

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddInstruction
          (InstructionBuilder *this,
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          *insn)

{
  iterator in_RAX;
  iterator local_18;
  
  local_18.super_iterator.node_ = (iterator)(iterator)in_RAX.node_;
  InstructionList::iterator::InsertBefore
            (&local_18,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&this->insert_before_);
  UpdateInstrToBlockMapping(this,(Instruction *)local_18.super_iterator.node_);
  UpdateDefUseMgr(this,(Instruction *)local_18.super_iterator.node_);
  return local_18.super_iterator.node_.node_;
}

Assistant:

Instruction* AddInstruction(std::unique_ptr<Instruction>&& insn) {
    Instruction* insn_ptr = &*insert_before_.InsertBefore(std::move(insn));
    UpdateInstrToBlockMapping(insn_ptr);
    UpdateDefUseMgr(insn_ptr);
    return insn_ptr;
  }